

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_factorize_bump.c
# Opt level: O0

lu_int __thiscall lu_factorize_bump(lu *this)

{
  int iVar1;
  lu_int *flink;
  lu_int *blink;
  long lVar2;
  long lVar3;
  lu_int lVar4;
  long in_RDI;
  lu_int status;
  lu_int *qinv;
  lu_int *pinv;
  lu_int *colcount_blink;
  lu_int *colcount_flink;
  lu *in_stack_00000028;
  lu_int m;
  lu *in_stack_000000a0;
  
  iVar1 = *(int *)(in_RDI + 0x54);
  flink = *(lu_int **)(in_RDI + 0x1d0);
  blink = *(lu_int **)(in_RDI + 0x1e0);
  lVar2 = *(long *)(in_RDI + 600);
  lVar3 = *(long *)(in_RDI + 0x268);
  while( true ) {
    while( true ) {
      if (iVar1 <= *(int *)(in_RDI + 0x13c) + *(int *)(in_RDI + 0x194)) {
        return 0;
      }
      if (*(int *)(in_RDI + 0x180) < 0) {
        lu_markowitz(in_stack_000000a0);
      }
      if (-1 < *(int *)(in_RDI + 0x17c)) break;
      lu_list_remove(flink,blink,*(lu_int *)(in_RDI + 0x180));
      *(undefined4 *)(in_RDI + 0x180) = 0xffffffff;
      *(int *)(in_RDI + 0x194) = *(int *)(in_RDI + 0x194) + 1;
    }
    lVar4 = lu_pivot(in_stack_00000028);
    if (lVar4 != 0) break;
    *(undefined4 *)(lVar2 + (long)*(int *)(in_RDI + 0x17c) * 4) = *(undefined4 *)(in_RDI + 0x13c);
    *(undefined4 *)(lVar3 + (long)*(int *)(in_RDI + 0x180) * 4) = *(undefined4 *)(in_RDI + 0x13c);
    *(undefined4 *)(in_RDI + 0x180) = 0xffffffff;
    *(undefined4 *)(in_RDI + 0x17c) = 0xffffffff;
    *(int *)(in_RDI + 0x13c) = *(int *)(in_RDI + 0x13c) + 1;
  }
  return lVar4;
}

Assistant:

lu_int lu_factorize_bump(struct lu *this)
{
    const lu_int m          = this->m;
    lu_int *colcount_flink  = this->colcount_flink;
    lu_int *colcount_blink  = this->colcount_blink;
    lu_int *pinv            = this->pinv;
    lu_int *qinv            = this->qinv;
    lu_int status = BASICLU_OK;

    while (this->rank + this->rankdef < m)
    {
        /*
         * Find pivot element. Markowitz search need not be called if the
         * previous call to lu_pivot() returned for reallocation. In this case
         * this->pivot_col is valid.
         */
        if (this->pivot_col < 0)
            lu_markowitz(this);
        assert(this->pivot_col >= 0);

        if (this->pivot_row < 0)
        {
            /* Eliminate empty column without choosing a pivot. */
            lu_list_remove(colcount_flink, colcount_blink, this->pivot_col);
            this->pivot_col = -1;
            this->rankdef++;
        }
        else
        {
            /* Eliminate pivot. This may require reallocation. */
            assert(pinv[this->pivot_row] == -1);
            assert(qinv[this->pivot_col] == -1);
            status = lu_pivot(this);
            if (status != BASICLU_OK)
                break;
            pinv[this->pivot_row] = this->rank;
            qinv[this->pivot_col] = this->rank;
            this->pivot_col = -1;
            this->pivot_row = -1;
            this->rank++;
        }
    }
    return status;
}